

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sexp_conflict
sexp_set_file_descriptor_status_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  sexp_conflict res;
  int err;
  long local_78;
  long local_70;
  int local_60;
  int local_58;
  int local_50;
  int local_48;
  sexp_conflict local_40;
  sexp_conflict local_8;
  
  if ((((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x10)) ||
      ((((ulong)in_RCX & 3) == 0 && (*in_RCX == 0x11)))) ||
     (((((ulong)in_RCX & 3) == 0 && (*in_RCX == 0x12)) || (((ulong)in_RCX & 1) == 1)))) {
    if ((((ulong)in_R8 & 1) == 1) || ((((ulong)in_R8 & 3) == 0 && (*in_R8 == 0xc)))) {
      if (((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x10)) ||
         ((((ulong)in_RCX & 3) == 0 && (*in_RCX == 0x11)))) {
        if (*(long *)(in_RCX + 8) == 0) {
          if (((*(ulong *)(in_RCX + 6) & 3) == 0) && (**(int **)(in_RCX + 6) == 0x12)) {
            local_50 = (int)*(undefined8 *)(*(long *)(in_RCX + 6) + 0x10);
          }
          else {
            local_50 = -1;
          }
          local_48 = local_50;
        }
        else {
          local_48 = fileno(*(FILE **)(in_RCX + 8));
        }
        local_58 = local_48;
      }
      else {
        if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x12)) {
          local_60 = (int)*(undefined8 *)(in_RCX + 4);
        }
        else {
          auVar1._8_8_ = (long)in_RCX >> 0x3f;
          auVar1._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
          local_60 = SUB164(auVar1 / SEXT816(2),0);
        }
        local_58 = local_60;
      }
      if (((ulong)in_R8 & 1) == 1) {
        auVar2._8_8_ = (long)in_R8 >> 0x3f;
        auVar2._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
        local_70 = SUB168(auVar2 / SEXT816(2),0);
      }
      else {
        if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
          local_78 = (long)(char)in_R8[2] * *(long *)(in_R8 + 6);
        }
        else {
          local_78 = 0;
        }
        local_70 = local_78;
      }
      iVar3 = fcntl(local_58,4,local_70);
      if (iVar3 == 0) {
        local_40 = (sexp_conflict)0x13e;
      }
      else {
        local_40 = (sexp_conflict)0x3e;
      }
      local_8 = local_40;
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)
              sexp_xtype_exception(in_RDI,in_RSI,"not a port or file descriptor",in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_set_file_descriptor_status_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg2) {
  int err = 0;
  sexp res;
  if (! (sexp_portp(arg0) || sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_xtype_exception(ctx, self, "not a port or file descriptor",arg0);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  err = fcntl((sexp_portp(arg0) ? sexp_port_fileno(arg0) : sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), F_SETFL, sexp_sint_value(arg2));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}